

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

int Ssc_GiaResimulateOneClass(Ssc_Man_t *p,int iRepr,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  int local_1c;
  int RetValue;
  int Ent;
  int iObj_local;
  int iRepr_local;
  Ssc_Man_t *p_local;
  
  iVar1 = Gia_ObjRepr(p->pAig,iObj);
  if (iRepr != iVar1) {
    __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,199,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  iVar1 = Gia_ObjIsHead(p->pAig,iRepr);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead( p->pAig, iRepr )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,200,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  Gia_ManIncrementTravId(p->pAig);
  iVar1 = Gia_ObjIsHead(p->pAig,iRepr);
  local_1c = iRepr;
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0xcb,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  for (; local_1c != 0; local_1c = Gia_ObjNext(p->pAig,local_1c)) {
    pObj = Gia_ManObj(p->pAig,local_1c);
    Ssc_GiaSimulatePattern_rec(p,pObj);
  }
  iVar1 = Ssc_GiaSimClassRefineOneBit(p->pAig,iRepr);
  iVar2 = Gia_ObjRepr(p->pAig,iObj);
  if (iRepr == iVar2) {
    __assert_fail("iRepr != Gia_ObjRepr(p->pAig, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0xd0,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  return iVar1;
}

Assistant:

int Ssc_GiaResimulateOneClass( Ssc_Man_t * p, int iRepr, int iObj )
{
    int Ent, RetValue;
    assert( iRepr == Gia_ObjRepr(p->pAig, iObj) );
    assert( Gia_ObjIsHead( p->pAig, iRepr ) );
    // set bit-values at the nodes according to the counter-example
    Gia_ManIncrementTravId( p->pAig );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
        Ssc_GiaSimulatePattern_rec( p, Gia_ManObj(p->pAig, Ent) );
    // refine one class using these bit-values
    RetValue = Ssc_GiaSimClassRefineOneBit( p->pAig, iRepr );
    // check that the candidate equivalence is indeed refined
    assert( iRepr != Gia_ObjRepr(p->pAig, iObj) );
    return RetValue;
}